

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

uint32_t __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddress(LineTable *this,SectionedAddress Address)

{
  uint32_t uVar1;
  SectionedAddress Address_00;
  
  Address_00.Address = Address.Address;
  uVar1 = lookupAddressImpl(this,Address);
  if (Address.SectionIndex == 0xffffffffffffffff || uVar1 != this->UnknownRowIndex) {
    return uVar1;
  }
  Address_00.SectionIndex = 0xffffffffffffffff;
  uVar1 = lookupAddressImpl(this,Address_00);
  return uVar1;
}

Assistant:

uint32_t DWARFDebugLine::LineTable::lookupAddress(
    object::SectionedAddress Address) const {

  // Search for relocatable addresses
  uint32_t Result = lookupAddressImpl(Address);

  if (Result != UnknownRowIndex ||
      Address.SectionIndex == object::SectionedAddress::UndefSection)
    return Result;

  // Search for absolute addresses
  Address.SectionIndex = object::SectionedAddress::UndefSection;
  return lookupAddressImpl(Address);
}